

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_light.cpp
# Opt level: O0

Light_SampleRes * embree::QuadLight_sample(Light *super,DifferentialGeometry *dg,Vec2f *s)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  float *in_RCX;
  long in_RDX;
  long in_RSI;
  Light_SampleRes *in_RDI;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  float cosd;
  float dist;
  Vec3fa dir;
  Vec3fa pos;
  QuadLight *self;
  Light_SampleRes *res;
  __m128 r;
  __m128 a_2;
  vfloat4 c;
  vfloat4 b;
  vfloat4 a;
  vfloat4 c_1;
  vfloat4 b_1;
  vfloat4 a_1;
  undefined8 local_b18;
  undefined8 uStack_b10;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  undefined8 local_aa8;
  undefined8 uStack_aa0;
  undefined8 local_a98;
  undefined8 uStack_a90;
  long local_a80;
  float *local_a78;
  long local_a70;
  undefined8 local_a08;
  undefined8 uStack_a00;
  float local_9ec;
  undefined8 *local_9e8;
  undefined8 *local_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  float local_9bc;
  undefined8 *local_9b8;
  undefined8 *local_9b0;
  float local_954;
  undefined8 *local_950;
  float local_944;
  undefined8 *local_940;
  undefined8 *local_918;
  undefined8 *local_910;
  undefined8 *local_908;
  undefined8 *local_900;
  undefined8 *local_8f8;
  undefined8 *local_8f0;
  undefined8 *local_8e8;
  undefined8 *local_8e0;
  undefined8 *local_8d8;
  undefined8 *local_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined8 *local_8b0;
  undefined8 *local_8a8;
  float local_8a0;
  undefined8 *local_880;
  undefined8 *local_878;
  undefined8 *local_870;
  undefined8 *local_850;
  undefined8 *local_848;
  undefined8 *local_840;
  undefined8 *local_838;
  undefined8 *local_830;
  undefined8 *local_828;
  float local_778;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 *local_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 *local_638;
  undefined8 *local_620;
  undefined8 *local_618;
  undefined8 *local_600;
  undefined8 *local_5f8;
  undefined8 *local_590;
  undefined8 *local_588;
  undefined8 *local_580;
  float local_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  undefined8 *local_568;
  undefined8 *local_560;
  undefined8 *local_558;
  undefined8 *local_550;
  float local_548;
  float fStack_544;
  float fStack_540;
  float fStack_53c;
  undefined8 *local_530;
  undefined8 *local_520;
  undefined8 *local_518;
  undefined8 *local_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 *local_4f0;
  float local_4a8;
  float fStack_4a4;
  float fStack_4a0;
  float fStack_49c;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 *local_470;
  undefined8 *local_468;
  undefined8 *local_460;
  undefined8 *local_458;
  undefined8 *local_450;
  undefined8 *local_428;
  undefined8 *local_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 *local_400;
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 *local_3d0;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_22c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float local_20c;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  undefined8 *local_1b0;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  undefined8 *local_190;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  undefined8 *local_150;
  undefined8 local_148;
  undefined8 uStack_140;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  undefined8 *local_110;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  undefined8 *local_f0;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  undefined8 *local_d0;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  float local_38;
  float fStack_34;
  float fStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_a80 = in_RSI;
  local_a78 = in_RCX;
  local_a70 = in_RDX;
  Light_SampleRes::Light_SampleRes(in_RDI);
  local_8e0 = (undefined8 *)(local_a80 + 0x10);
  local_9b8 = (undefined8 *)(local_a80 + 0x20);
  local_9bc = *local_a78;
  local_9b0 = &local_ab8;
  local_950 = &local_9d8;
  local_68 = CONCAT44(local_9bc,local_9bc);
  uStack_60 = CONCAT44(local_9bc,local_9bc);
  uVar1 = *local_9b8;
  uVar2 = *(undefined8 *)(local_a80 + 0x28);
  local_58._0_4_ = (float)uVar1;
  local_58._4_4_ = (float)((ulong)uVar1 >> 0x20);
  uStack_50._0_4_ = (float)uVar2;
  uStack_50._4_4_ = (float)((ulong)uVar2 >> 0x20);
  local_1a8 = (float)local_58 * local_9bc;
  fStack_1a4 = local_58._4_4_ * local_9bc;
  fStack_1a0 = (float)uStack_50 * local_9bc;
  fStack_19c = uStack_50._4_4_ * local_9bc;
  local_2e8 = CONCAT44(fStack_1a4,local_1a8);
  uStack_2e0 = CONCAT44(fStack_19c,fStack_1a0);
  local_8f8 = &local_aa8;
  uVar3 = *local_8e0;
  uVar4 = *(undefined8 *)(local_a80 + 0x18);
  local_2d8._0_4_ = (float)uVar3;
  local_2d8._4_4_ = (float)((ulong)uVar3 >> 0x20);
  uStack_2d0._0_4_ = (float)uVar4;
  uStack_2d0._4_4_ = (float)((ulong)uVar4 >> 0x20);
  local_128 = (float)local_2d8 + local_1a8;
  fStack_124 = local_2d8._4_4_ + fStack_1a4;
  fStack_120 = (float)uStack_2d0 + fStack_1a0;
  fStack_11c = uStack_2d0._4_4_ + fStack_19c;
  local_2b8 = CONCAT44(fStack_124,local_128);
  uStack_2b0 = CONCAT44(fStack_11c,fStack_120);
  local_9e8 = (undefined8 *)(local_a80 + 0x30);
  local_9ec = local_a78[1];
  local_9e0 = &local_ac8;
  local_940 = &local_a08;
  local_88 = CONCAT44(local_9ec,local_9ec);
  uStack_80 = CONCAT44(local_9ec,local_9ec);
  uVar5 = *local_9e8;
  uVar6 = *(undefined8 *)(local_a80 + 0x38);
  local_78._0_4_ = (float)uVar5;
  local_78._4_4_ = (float)((ulong)uVar5 >> 0x20);
  uStack_70._0_4_ = (float)uVar6;
  uStack_70._4_4_ = (float)((ulong)uVar6 >> 0x20);
  local_1c8 = (float)local_78 * local_9ec;
  fStack_1c4 = local_78._4_4_ * local_9ec;
  fStack_1c0 = (float)uStack_70 * local_9ec;
  fStack_1bc = uStack_70._4_4_ * local_9ec;
  local_2c8 = CONCAT44(fStack_1c4,local_1c8);
  uStack_2c0 = CONCAT44(fStack_1bc,fStack_1c0);
  local_910 = &local_a98;
  local_108 = local_128 + local_1c8;
  fStack_104 = fStack_124 + fStack_1c4;
  fStack_100 = fStack_120 + fStack_1c0;
  fStack_fc = fStack_11c + fStack_1bc;
  local_1f8 = CONCAT44(fStack_104,local_108);
  uStack_1f0 = CONCAT44(fStack_fc,fStack_100);
  local_918 = (undefined8 *)(local_a70 + 0x20);
  local_908 = &local_ad8;
  uVar7 = *local_918;
  uVar8 = *(undefined8 *)(local_a70 + 0x28);
  local_208._0_4_ = (float)uVar7;
  local_208._4_4_ = (float)((ulong)uVar7 >> 0x20);
  uStack_200._0_4_ = (float)uVar8;
  uStack_200._4_4_ = (float)((ulong)uVar8 >> 0x20);
  local_e8 = local_108 - (float)local_208;
  fStack_e4 = fStack_104 - local_208._4_4_;
  fStack_e0 = fStack_100 - (float)uStack_200;
  fStack_dc = fStack_fc - uStack_200._4_4_;
  local_28 = CONCAT44(fStack_e4,local_e8);
  uStack_20 = CONCAT44(fStack_dc,fStack_e0);
  local_870 = &local_8c8;
  local_168 = local_e8 * local_e8;
  local_4a8 = fStack_e4 * fStack_e4;
  local_3f8 = fStack_e0 * fStack_e0;
  fStack_15c = fStack_dc * fStack_dc;
  local_648 = CONCAT44(local_4a8,local_168);
  uStack_640 = CONCAT44(fStack_15c,local_3f8);
  local_638 = &local_708;
  local_618 = &local_718;
  local_508 = CONCAT44(local_4a8,local_4a8);
  uStack_500 = CONCAT44(local_4a8,local_4a8);
  local_5f8 = &local_728;
  local_418 = CONCAT44(local_3f8,local_3f8);
  uStack_410 = CONCAT44(local_3f8,local_3f8);
  local_588 = &local_748;
  local_548 = local_168 + local_4a8;
  fStack_544 = local_4a8 + local_4a8;
  fStack_540 = local_3f8 + local_4a8;
  fStack_53c = fStack_15c + local_4a8;
  local_338 = CONCAT44(fStack_544,local_548);
  uStack_330 = CONCAT44(fStack_53c,fStack_540);
  local_580 = &local_738;
  local_8a0 = local_548 + local_3f8;
  fStack_574 = fStack_544 + local_3f8;
  fStack_570 = fStack_540 + local_3f8;
  fStack_56c = fStack_53c + local_3f8;
  local_6e8 = CONCAT44(fStack_574,local_8a0);
  uStack_6e0 = CONCAT44(fStack_56c,fStack_570);
  local_954 = local_9bc;
  local_944 = local_9ec;
  local_900 = local_9e0;
  local_8f0 = local_910;
  local_8e8 = local_9b0;
  local_8d8 = local_8f8;
  local_8d0 = local_908;
  local_8b0 = local_908;
  local_8a8 = local_908;
  local_880 = local_908;
  local_878 = local_908;
  local_850 = local_950;
  local_848 = local_9b8;
  local_840 = local_9b0;
  local_838 = local_940;
  local_830 = local_9e8;
  local_828 = local_9e0;
  local_6f0 = local_870;
  local_620 = local_638;
  local_600 = local_638;
  local_590 = local_5f8;
  local_578 = local_8a0;
  local_568 = local_580;
  local_560 = local_618;
  local_558 = local_638;
  local_550 = local_588;
  local_530 = local_588;
  local_520 = local_580;
  local_518 = local_638;
  local_510 = local_618;
  local_4f0 = local_618;
  fStack_4a4 = local_4a8;
  fStack_4a0 = local_4a8;
  fStack_49c = local_4a8;
  local_488 = local_648;
  uStack_480 = uStack_640;
  local_470 = local_638;
  local_468 = local_618;
  local_460 = local_638;
  local_458 = local_5f8;
  local_450 = local_588;
  local_428 = local_638;
  local_420 = local_5f8;
  local_400 = local_5f8;
  fStack_3f4 = local_3f8;
  fStack_3f0 = local_3f8;
  fStack_3ec = local_3f8;
  local_3e8 = local_648;
  uStack_3e0 = uStack_640;
  local_3d0 = local_638;
  local_368 = local_508;
  uStack_360 = uStack_500;
  local_358 = local_648;
  uStack_350 = uStack_640;
  local_348 = local_418;
  uStack_340 = uStack_410;
  local_2d8 = uVar3;
  uStack_2d0 = uVar4;
  local_248 = local_9ec;
  fStack_244 = local_9ec;
  fStack_240 = local_9ec;
  fStack_23c = local_9ec;
  local_22c = local_9ec;
  local_228 = local_9bc;
  fStack_224 = local_9bc;
  fStack_220 = local_9bc;
  fStack_21c = local_9bc;
  local_20c = local_9bc;
  local_208 = uVar7;
  uStack_200 = uVar8;
  local_1b0 = local_9e0;
  local_190 = local_9b0;
  fStack_164 = local_4a8;
  fStack_160 = local_3f8;
  local_150 = local_870;
  local_110 = local_8f8;
  local_f0 = local_910;
  local_d0 = local_908;
  local_78 = uVar5;
  uStack_70 = uVar6;
  local_58 = uVar1;
  uStack_50 = uVar2;
  local_18 = local_28;
  uStack_10 = uStack_20;
  local_ad8 = local_28;
  uStack_ad0 = uStack_20;
  local_ac8 = local_2c8;
  uStack_ac0 = uStack_2c0;
  local_ab8 = local_2e8;
  uStack_ab0 = uStack_2e0;
  local_aa8 = local_2b8;
  uStack_aa0 = uStack_2b0;
  local_a98 = local_1f8;
  uStack_a90 = uStack_1f0;
  local_a08 = local_88;
  uStack_a00 = uStack_80;
  local_9d8 = local_68;
  uStack_9d0 = uStack_60;
  local_8c8 = local_648;
  uStack_8c0 = uStack_640;
  local_748 = local_338;
  uStack_740 = uStack_330;
  local_738 = local_6e8;
  uStack_730 = uStack_6e0;
  local_728 = local_418;
  uStack_720 = uStack_410;
  local_718 = local_508;
  uStack_710 = uStack_500;
  local_708 = local_648;
  uStack_700 = uStack_640;
  fVar10 = sqrtf(local_8a0);
  auVar9._8_8_ = uStack_ad0;
  auVar9._0_8_ = local_ad8;
  auVar12._4_4_ = fVar10;
  auVar12._0_4_ = fVar10;
  auVar12._12_4_ = fVar10;
  auVar12._8_4_ = fVar10;
  auVar12 = divps(auVar9,auVar12);
  local_148 = auVar12._0_8_;
  uStack_140 = auVar12._8_8_;
  *(undefined8 *)&(in_RDI->dir).field_0 = local_148;
  *(undefined8 *)((long)&(in_RDI->dir).field_0 + 8) = uStack_140;
  in_RDI->dist = fVar10;
  uVar1 = *(undefined8 *)&(in_RDI->dir).field_0;
  local_38 = (float)*(undefined8 *)(local_a80 + 0x50);
  fStack_34 = (float)((ulong)*(undefined8 *)(local_a80 + 0x50) >> 0x20);
  fStack_30 = (float)*(undefined8 *)(local_a80 + 0x58);
  local_48 = (float)uVar1;
  fStack_44 = (float)((ulong)uVar1 >> 0x20);
  fStack_40 = (float)*(undefined8 *)((long)&(in_RDI->dir).field_0 + 8);
  fVar11 = local_38 * local_48 + fStack_34 * fStack_44 + fStack_30 * fStack_40;
  in_RDI->pdf = (*(float *)(local_a80 + 0x60) * fVar10 * fVar10) / ABS(fVar11);
  if (fVar11 <= 0.0) {
    local_b18 = 0;
    uStack_b10 = 0;
  }
  else {
    fVar10 = in_RDI->pdf;
    auVar12 = rcpss(ZEXT416((uint)fVar10),ZEXT416((uint)fVar10));
    local_778 = auVar12._0_4_;
    local_778 = local_778 * (2.0 - local_778 * fVar10);
    local_98 = (float)*(undefined8 *)(local_a80 + 0x40);
    fStack_94 = (float)((ulong)*(undefined8 *)(local_a80 + 0x40) >> 0x20);
    fStack_90 = (float)*(undefined8 *)(local_a80 + 0x48);
    fStack_8c = (float)((ulong)*(undefined8 *)(local_a80 + 0x48) >> 0x20);
    local_b18 = CONCAT44(fStack_94 * local_778,local_98 * local_778);
    uStack_b10 = CONCAT44(fStack_8c * local_778,fStack_90 * local_778);
  }
  *(undefined8 *)&(in_RDI->weight).field_0 = local_b18;
  *(undefined8 *)((long)&(in_RDI->weight).field_0 + 8) = uStack_b10;
  return in_RDI;
}

Assistant:

SYCL_EXTERNAL Light_SampleRes QuadLight_sample(const Light* super,
                                                              const DifferentialGeometry& dg,
                                                              const Vec2f& s)
{
  const QuadLight* self = (QuadLight*)super;
  Light_SampleRes res;

  // res position on light with density ppdf = 1/area
  // TODO: use solid angle sampling
  const Vec3fa pos = self->position + self->edge1 * s.x + self->edge2 * s.y;

  // extant light vector from the hit point
  const Vec3fa dir = pos - dg.P;
  const float dist = length(dir);

  // normalized light vector
  res.dir = dir / dist;
  res.dist = dist;

  // convert to pdf wrt. solid angle
  const float cosd = dot(self->nnormal, res.dir);
  res.pdf = self->ppdf * (dist * dist) / abs(cosd);

  // emit only to one side
  res.weight = cosd > 0.f ? self->radiance * rcp(res.pdf) : Vec3fa(0.f);

  return res;
}